

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredNoChangeTest_Test::TestBody
          (ComparisonTest_IgnoredNoChangeTest_Test *this)

{
  ComparisonTest_IgnoredNoChangeTest_Test *s;
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena;
  char *message;
  TestDiffMessage *this_00;
  AssertHelper local_a0;
  Message local_98;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator<char> local_49;
  string local_48;
  ComparisonTest_IgnoredNoChangeTest_Test *local_28;
  ComparisonTest_IgnoredNoChangeTest_Test *this_local;
  TestDiffMessage *local_18;
  anon_union_168_1_493b367e_for_TestDiffMessage_3 *local_10;
  
  local_28 = this;
  proto2_unittest::TestDiffMessage::set_v(&(this->super_ComparisonTest).proto1diff_,3);
  this_00 = &(this->super_ComparisonTest).proto2diff_;
  proto2_unittest::TestDiffMessage::set_v(this_00,3);
  this_local = (ComparisonTest_IgnoredNoChangeTest_Test *)0x1d63234;
  local_10 = &(this->super_ComparisonTest).proto2diff_.field_0;
  local_18 = this_00;
  puVar2 = internal::HasBits<1>::operator[]
                     (&(this->super_ComparisonTest).proto2diff_.field_0._impl_._has_bits_,0);
  s = this_local;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set
            (&(this->super_ComparisonTest).proto2diff_.field_0._impl_.w_,(char *)s,arena);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"v",&local_49);
  ComparisonTest::ignore_field(&this->super_ComparisonTest,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  protobuf::(anonymous_namespace)::ComparisonTest::RunDiff_abi_cxx11_(&local_90,this);
  testing::internal::EqHelper::
  Compare<char[28],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_70,"\"ignored: v\\n\" \"added: w: \\\"foo\\\"\\n\"","RunDiff()",
             (char (*) [28])"ignored: v\nadded: w: \"foo\"\n",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xde9,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredNoChangeTest) {
  proto1diff_.set_v(3);
  proto2diff_.set_v(3);
  proto2diff_.set_w("foo");

  ignore_field("v");

  EXPECT_EQ(
      "ignored: v\n"
      "added: w: \"foo\"\n",
      RunDiff());
}